

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O2

int InternalFixupSectionNames_SectionName_Test::AddToRegistry(void)

{
  _Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
  *__last;
  _Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
  *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  UnitTest *this_00;
  ParameterizedTestSuiteRegistry *this_01;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames> *pPVar1;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  _Var2;
  element_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer __result;
  pointer psVar4;
  ulong uVar5;
  _Tp_alloc_type *__alloc;
  CodeLocation *code_location;
  size_t __n;
  ulong uVar6;
  ulong uVar7;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  element_type *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  _Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
  *local_f0;
  string local_e8 [32];
  CodeLocation local_c8;
  string local_a0 [32];
  undefined4 local_80;
  CodeLocation local_78;
  string local_50 [32];
  
  this_00 = testing::UnitTest::GetInstance();
  this_01 = testing::UnitTest::parameterized_test_registry(this_00);
  std::__cxx11::string::string
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
             ,&local_101);
  std::__cxx11::string::string(local_a0,local_50);
  local_80 = 0xa9;
  pPVar1 = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<(anonymous_namespace)::InternalFixupSectionNames>
                     (this_01,(char *)local_a0,code_location);
  _Var2.
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
        )operator_new(8);
  *(undefined ***)
   _Var2.
   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
   ._M_head_impl = &PTR__TestMetaFactoryBase_0022d410;
  std::__cxx11::string::string
            (local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
             ,&local_102);
  std::__cxx11::string::string((string *)&local_c8,local_e8);
  local_c8.line = 0xa9;
  this_02 = (element_type *)operator_new(0x70);
  testing::internal::CodeLocation::CodeLocation(&local_78,&local_c8);
  std::__cxx11::string::string((string *)this_02,"InternalFixupSectionNames",&local_103);
  std::__cxx11::string::string((string *)&this_02->test_base_name,"SectionName",&local_103);
  (this_02->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
       = _Var2.
         super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_char_*,_pstore::repo::section_kind>_>_*,_false>
         ._M_head_impl;
  testing::internal::CodeLocation::CodeLocation(&this_02->code_location,&local_78);
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = this_02;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (_Var3._M_pi)->_M_use_count = 1;
  (_Var3._M_pi)->_M_weak_count = 1;
  (_Var3._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0022d220;
  _Var3._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_02;
  __last = (_Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
            *)(pPVar1->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (_Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                 *)(pPVar1->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_f0 = (_Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                *)(pPVar1->tests_).
                  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_f8._M_pi = _Var3._M_pi;
    if ((long)__last - (long)local_f0 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = (long)__last - (long)local_f0 >> 4;
    uVar5 = 1;
    if (__last != local_f0) {
      uVar5 = uVar6;
    }
    uVar7 = uVar5 + uVar6;
    if (0x7fffffffffffffe < uVar7) {
      uVar7 = 0x7ffffffffffffff;
    }
    __alloc = (_Tp_alloc_type *)(uVar5 + uVar6);
    if (CARRY8(uVar5,uVar6)) {
      uVar7 = 0x7ffffffffffffff;
    }
    if (uVar7 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar7 << 4);
      _Var3._M_pi = local_f8._M_pi;
      this_02 = local_100;
    }
    this = local_f0;
    __result[uVar6].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = this_02;
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __result[uVar6].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var3._M_pi;
    local_100 = (element_type *)0x0;
    psVar4 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
             ::_S_relocate((pointer)local_f0,(pointer)__last,__result,__alloc);
    psVar4 = std::
             vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
             ::_S_relocate((pointer)__last,(pointer)__last,psVar4 + 1,__alloc);
    std::
    _Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ::_M_deallocate(this,(pointer)((long)(pPVar1->tests_).
                                         super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)this >> 4),__n);
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar4;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar7;
  }
  else {
    (__last->_M_impl).super__Vector_impl_data._M_start = (pointer)this_02;
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    &(__last->_M_impl).super__Vector_impl_data._M_finish)->_M_pi = _Var3._M_pi;
    local_100 = (element_type *)0x0;
    (pPVar1->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::InternalFixupSectionNames>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&(__last->_M_impl).super__Vector_impl_data._M_end_of_storage;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_50);
  return 0;
}

Assistant:

TEST_P (InternalFixupSectionNames, SectionName) {
    auto const & ns = GetParam ();
    std::ostringstream os;
    os << R"({ "section" : ")" << std::get<pstore::gsl::czstring> (ns)
       << R"(", "type":17, "offset":19, "addend":-23 })";

    internal_fixup_collection fixups;
    auto const & parser = this->parse (os.str (), &fixups);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (fixups.size (), 1U);
    EXPECT_EQ (fixups[0].section, std::get<pstore::repo::section_kind> (ns));
    EXPECT_EQ (fixups[0].type, 17U);
    EXPECT_EQ (fixups[0].offset, 19U);
    EXPECT_EQ (fixups[0].addend, -23);
}